

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

SizeType __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  ushort uVar1;
  
  uVar1 = (this->data_).f.flags;
  if ((uVar1 >> 10 & 1) == 0) {
    __assert_fail("IsString()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x742,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::GetStringLength() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if ((uVar1 >> 0xc & 1) == 0) {
    return (this->data_).s.length;
  }
  return 0xd - (int)(this->data_).ss.str[0xd];
}

Assistant:

bool IsString() const { return (data_.f.flags & kStringFlag) != 0; }